

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAtomTypesSectionParser.cpp
# Opt level: O3

void __thiscall
OpenMD::EAMAtomTypesSectionParser::parseLine
          (EAMAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  double dVar1;
  double dVar2;
  iterator iVar3;
  RealType RVar4;
  RealType RVar5;
  undefined8 uVar6;
  EAMAdapter ea_00;
  int iVar7;
  int iVar8;
  AtomType *this_00;
  ifstrstream *input;
  long *plVar9;
  size_t sVar10;
  pointer pdVar11;
  ulong uVar12;
  _Alloc_hider _Var14;
  vector<double,_std::allocator<double>_> *pvVar15;
  ifstrstream *this_01;
  int in_R8D;
  string funcflFile;
  StringTokenizer tokenizer;
  StringTokenizer tokenizer1;
  EAMAdapter ea;
  string eamParameterType;
  vector<double,_std::allocator<double>_> F;
  string atomTypeName;
  char buffer [65535];
  undefined1 auStack_10398 [40];
  string sStack_10370;
  RealType RStack_10350;
  RealType RStack_10348;
  RealType RStack_10340;
  RealType RStack_10338;
  RealType RStack_10330;
  RealType RStack_10328;
  RealType RStack_10320;
  RealType RStack_10318;
  RealType RStack_10310;
  RealType RStack_10308;
  StringTokenizer SStack_10300;
  undefined1 auStack_102a8 [88];
  RealType RStack_10250;
  RealType RStack_10248;
  EAMAdapter EStack_10240;
  RealType RStack_10238;
  RealType RStack_10230;
  RealType RStack_10228;
  RealType RStack_10220;
  string sStack_10218;
  vector<double,_std::allocator<double>_> vStack_101f8;
  RealType RStack_101d8;
  RealType RStack_101d0;
  vector<double,_std::allocator<double>_> vStack_101c8;
  vector<double,_std::allocator<double>_> vStack_101b0;
  vector<double,_std::allocator<double>_> vStack_10198;
  vector<double,_std::allocator<double>_> vStack_10180;
  vector<double,_std::allocator<double>_> vStack_10168;
  vector<double,_std::allocator<double>_> vStack_10150;
  vector<double,_std::allocator<double>_> vStack_10138;
  vector<double,_std::allocator<double>_> vStack_10120;
  vector<double,_std::allocator<double>_> vStack_10108;
  string sStack_100f0;
  string sStack_100d0;
  string sStack_100b0;
  string sStack_10090;
  string sStack_10070;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vStack_10050;
  undefined1 auStack_10038 [65544];
  double *pdVar13;
  
  this->eus_ = (this->options_->MetallicEnergyUnitScaling).data_;
  this->dus_ = (this->options_->DistanceUnitScaling).data_;
  auStack_10038._0_8_ = (vector<double,_std::allocator<double>_> *)(auStack_10038 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_10038," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&SStack_10300,line,(string *)auStack_10038);
  if ((vector<double,_std::allocator<double>_> *)auStack_10038._0_8_ !=
      (vector<double,_std::allocator<double>_> *)(auStack_10038 + 0x10)) {
    operator_delete((void *)auStack_10038._0_8_,auStack_10038._16_8_ + 1);
  }
  iVar7 = StringTokenizer::countTokens(&SStack_10300);
  iVar8 = StringTokenizer::countTokens(&SStack_10300);
  if (iVar8 < 2) {
    snprintf(painCave.errMsg,2000,"EAMAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
    goto LAB_00191874;
  }
  StringTokenizer::nextToken_abi_cxx11_(&sStack_10070,&SStack_10300);
  StringTokenizer::nextToken_abi_cxx11_(&sStack_10218,&SStack_10300);
  this_00 = ForceField::getAtomType(ff,&sStack_10070);
  if (this_00 == (AtomType *)0x0) {
    snprintf(painCave.errMsg,2000,"EAMAtomTypesSectionParser Error: Can not find AtomType [%s]\n",
             sStack_10070._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
    goto LAB_00191832;
  }
  EStack_10240.at_ = this_00;
  std::locale::locale((locale *)auStack_10038);
  toUpper<std::__cxx11::string>(&sStack_10218,(locale *)auStack_10038);
  std::locale::~locale((locale *)auStack_10038);
  iVar8 = std::__cxx11::string::compare((char *)&sStack_10218);
  if (iVar8 == 0) {
    StringTokenizer::nextToken_abi_cxx11_((string *)auStack_10038,&SStack_10300);
    ea_00.at_ = EStack_10240.at_;
    AtomType::getIdent(this_00);
    parseFuncflFile(this,ff,ea_00,(string *)auStack_10038,in_R8D);
LAB_00191815:
    pdVar13 = (double *)auStack_10038._16_8_;
    pvVar15 = (vector<double,_std::allocator<double>_> *)auStack_10038._0_8_;
    if ((vector<double,_std::allocator<double>_> *)auStack_10038._0_8_ !=
        (vector<double,_std::allocator<double>_> *)(auStack_10038 + 0x10)) {
LAB_0019182a:
      uVar12 = (long)pdVar13 + 1;
LAB_0019182d:
      operator_delete(pvVar15,uVar12);
    }
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)&sStack_10218);
    if ((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare((char *)&sStack_10218), iVar8 == 0))
    {
      if (0x15 < iVar7) {
        StringTokenizer::nextToken_abi_cxx11_((string *)auStack_10038,&SStack_10300);
        std::locale::locale((locale *)auStack_102a8);
        toUpper<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   auStack_10038,(locale *)auStack_102a8);
        std::locale::~locale((locale *)auStack_102a8);
        RStack_10308 = this->dus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10310 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10318 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10320 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10328 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10330 = this->eus_;
        RStack_10338 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10340 = this->eus_;
        RStack_10348 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10350 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10250 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        auStack_102a8._0_8_ = (pointer)0x0;
        auStack_102a8._8_8_ = (double *)0x0;
        auStack_102a8._16_8_ = (double *)0x0;
        dVar1 = this->eus_;
        RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        auStack_10398._0_8_ = dVar1 * RVar4;
        if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                     (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
        }
        else {
          *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
          auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
        }
        dVar1 = this->eus_;
        RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        auStack_10398._0_8_ = dVar1 * RVar4;
        if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                     (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
        }
        else {
          *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
          auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
        }
        dVar1 = this->eus_;
        RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        auStack_10398._0_8_ = dVar1 * RVar4;
        if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                     (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
        }
        else {
          *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
          auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
        }
        dVar1 = this->eus_;
        RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        auStack_10398._0_8_ = dVar1 * RVar4;
        if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                     (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
        }
        else {
          *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
          auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
        }
        auStack_10398._0_8_ = (vector<double,_std::allocator<double>_> *)0x0;
        auStack_10398._8_8_ = (pointer)0x0;
        auStack_10398._16_8_ = (double *)0x0;
        dVar1 = this->eus_;
        RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar1 * RVar4);
        if (auStack_10398._8_8_ == auStack_10398._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_10398,
                     (iterator)auStack_10398._8_8_,(double *)&sStack_10370);
        }
        else {
          *(pointer *)auStack_10398._8_8_ = sStack_10370._M_dataplus._M_p;
          auStack_10398._8_8_ = auStack_10398._8_8_ + 8;
        }
        dVar1 = this->eus_;
        RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar1 * RVar4);
        if (auStack_10398._8_8_ == auStack_10398._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_10398,
                     (iterator)auStack_10398._8_8_,(double *)&sStack_10370);
        }
        else {
          *(pointer *)auStack_10398._8_8_ = sStack_10370._M_dataplus._M_p;
          auStack_10398._8_8_ = auStack_10398._8_8_ + 8;
        }
        dVar1 = this->eus_;
        RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar1 * RVar4);
        if (auStack_10398._8_8_ == auStack_10398._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_10398,
                     (iterator)auStack_10398._8_8_,(double *)&sStack_10370);
        }
        else {
          *(pointer *)auStack_10398._8_8_ = sStack_10370._M_dataplus._M_p;
          auStack_10398._8_8_ = auStack_10398._8_8_ + 8;
        }
        dVar1 = this->eus_;
        RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar1 * RVar4);
        if (auStack_10398._8_8_ == auStack_10398._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_10398,
                     (iterator)auStack_10398._8_8_,(double *)&sStack_10370);
        }
        else {
          *(pointer *)auStack_10398._8_8_ = sStack_10370._M_dataplus._M_p;
          auStack_10398._8_8_ = auStack_10398._8_8_ + 8;
        }
        RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10248 = this->eus_;
        RStack_10238 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10090._M_dataplus._M_p = (pointer)&sStack_10090.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&sStack_10090,auStack_10038._0_8_,
                   (pointer)(auStack_10038._8_8_ + auStack_10038._0_8_));
        std::vector<double,_std::allocator<double>_>::vector
                  (&vStack_10108,(vector<double,_std::allocator<double>_> *)auStack_102a8);
        std::vector<double,_std::allocator<double>_>::vector
                  (&vStack_10120,(vector<double,_std::allocator<double>_> *)auStack_10398);
        EAMAdapter::makeZhou2001
                  (&EStack_10240,&sStack_10090,RStack_10308 * RVar5,RStack_10310,RStack_10318,
                   RStack_10320,RStack_10328,RStack_10330 * RStack_10338,RStack_10340 * RStack_10348
                   ,RStack_10350,RStack_10250,&vStack_10108,&vStack_10120,RVar4,
                   RStack_10248 * RStack_10238);
        if (vStack_10120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_10120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vStack_10120.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_10120.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (vStack_10108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_10108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vStack_10108.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_10108.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        _Var14._M_p = sStack_10090._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_10090._M_dataplus._M_p != &sStack_10090.field_2) {
LAB_001917d9:
          operator_delete(_Var14._M_p,sStack_10090.field_2._M_allocated_capacity + 1);
        }
LAB_001917e1:
        if ((vector<double,_std::allocator<double>_> *)auStack_10398._0_8_ !=
            (vector<double,_std::allocator<double>_> *)0x0) {
          operator_delete((void *)auStack_10398._0_8_,auStack_10398._16_8_ - auStack_10398._0_8_);
        }
        if ((pointer)auStack_102a8._0_8_ != (pointer)0x0) {
          operator_delete((void *)auStack_102a8._0_8_,auStack_102a8._16_8_ - auStack_102a8._0_8_);
        }
        goto LAB_00191815;
      }
LAB_00190ff5:
      snprintf(painCave.errMsg,2000,
               "EAMAtomTypesSectionParser Error: Not enough tokens at line %d\n",(ulong)(uint)lineNo
              );
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)&sStack_10218);
      if (iVar8 == 0) {
        if (0x18 < iVar7) {
          StringTokenizer::nextToken_abi_cxx11_((string *)auStack_10038,&SStack_10300);
          std::locale::locale((locale *)auStack_102a8);
          toUpper<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_10038,(locale *)auStack_102a8);
          std::locale::~locale((locale *)auStack_102a8);
          RStack_10308 = this->dus_;
          RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10310 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10318 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10320 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10328 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10330 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10338 = this->eus_;
          RStack_10340 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10348 = this->eus_;
          RStack_10350 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10250 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10248 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          auStack_102a8._0_8_ = (pointer)0x0;
          auStack_102a8._8_8_ = (double *)0x0;
          auStack_102a8._16_8_ = (double *)0x0;
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          auStack_10398._0_8_ = dVar1 * RVar4;
          if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                       (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
          }
          else {
            *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
            auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          auStack_10398._0_8_ = dVar1 * RVar4;
          if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                       (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
          }
          else {
            *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
            auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          auStack_10398._0_8_ = dVar1 * RVar4;
          if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                       (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
          }
          else {
            *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
            auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          auStack_10398._0_8_ = dVar1 * RVar4;
          if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                       (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
          }
          else {
            *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
            auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
          }
          auStack_10398._0_8_ = (vector<double,_std::allocator<double>_> *)0x0;
          auStack_10398._8_8_ = (pointer)0x0;
          auStack_10398._16_8_ = (double *)0x0;
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          sStack_10370._M_dataplus._M_p = (pointer)(dVar1 * RVar4);
          if (auStack_10398._8_8_ == auStack_10398._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_10398,
                       (iterator)auStack_10398._8_8_,(double *)&sStack_10370);
          }
          else {
            *(pointer *)auStack_10398._8_8_ = sStack_10370._M_dataplus._M_p;
            auStack_10398._8_8_ = auStack_10398._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          sStack_10370._M_dataplus._M_p = (pointer)(dVar1 * RVar4);
          if (auStack_10398._8_8_ == auStack_10398._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_10398,
                       (iterator)auStack_10398._8_8_,(double *)&sStack_10370);
          }
          else {
            *(pointer *)auStack_10398._8_8_ = sStack_10370._M_dataplus._M_p;
            auStack_10398._8_8_ = auStack_10398._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          sStack_10370._M_dataplus._M_p = (pointer)(dVar1 * RVar4);
          if (auStack_10398._8_8_ == auStack_10398._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_10398,
                       (iterator)auStack_10398._8_8_,(double *)&sStack_10370);
          }
          else {
            *(pointer *)auStack_10398._8_8_ = sStack_10370._M_dataplus._M_p;
            auStack_10398._8_8_ = auStack_10398._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          sStack_10370._M_dataplus._M_p = (pointer)(dVar1 * RVar4);
          if (auStack_10398._8_8_ == auStack_10398._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_10398,
                       (iterator)auStack_10398._8_8_,(double *)&sStack_10370);
          }
          else {
            *(pointer *)auStack_10398._8_8_ = sStack_10370._M_dataplus._M_p;
            auStack_10398._8_8_ = auStack_10398._8_8_ + 8;
          }
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10238 = this->eus_;
          RStack_10220 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10228 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10230 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          sStack_100b0._M_dataplus._M_p = (pointer)&sStack_100b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&sStack_100b0,auStack_10038._0_8_,
                     (pointer)(auStack_10038._8_8_ + auStack_10038._0_8_));
          std::vector<double,_std::allocator<double>_>::vector
                    (&vStack_10138,(vector<double,_std::allocator<double>_> *)auStack_102a8);
          std::vector<double,_std::allocator<double>_>::vector
                    (&vStack_10150,(vector<double,_std::allocator<double>_> *)auStack_10398);
          EAMAdapter::makeZhou2004
                    (&EStack_10240,&sStack_100b0,RStack_10308 * RVar5,RStack_10310,RStack_10318,
                     RStack_10320,RStack_10328,RStack_10330,RStack_10338 * RStack_10340,
                     RStack_10348 * RStack_10350,RStack_10250,RStack_10248,&vStack_10138,
                     &vStack_10150,RVar4,RStack_10238 * RStack_10220,RStack_10228,RStack_10230);
          if (vStack_10150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(vStack_10150.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start,
                            (long)vStack_10150.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)vStack_10150.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (vStack_10138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(vStack_10138.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start,
                            (long)vStack_10138.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)vStack_10138.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          sStack_10090.field_2._M_allocated_capacity = sStack_100b0.field_2._M_allocated_capacity;
          _Var14._M_p = sStack_100b0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_100b0._M_dataplus._M_p != &sStack_100b0.field_2) goto LAB_001917d9;
          goto LAB_001917e1;
        }
        goto LAB_00190ff5;
      }
      iVar8 = std::__cxx11::string::compare((char *)&sStack_10218);
      if (iVar8 == 0) {
        if (0x17 < iVar7) {
          StringTokenizer::nextToken_abi_cxx11_((string *)auStack_10038,&SStack_10300);
          std::locale::locale((locale *)auStack_102a8);
          toUpper<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_10038,(locale *)auStack_102a8);
          std::locale::~locale((locale *)auStack_102a8);
          RStack_10308 = this->dus_;
          RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10310 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10318 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10320 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10328 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10330 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10338 = this->eus_;
          RStack_10340 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10348 = this->eus_;
          RStack_10350 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10250 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10248 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          auStack_102a8._0_8_ = (pointer)0x0;
          auStack_102a8._8_8_ = (double *)0x0;
          auStack_102a8._16_8_ = (double *)0x0;
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          auStack_10398._0_8_ = dVar1 * RVar4;
          if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                       (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
          }
          else {
            *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
            auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          auStack_10398._0_8_ = dVar1 * RVar4;
          if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                       (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
          }
          else {
            *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
            auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          auStack_10398._0_8_ = dVar1 * RVar4;
          if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                       (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
          }
          else {
            *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
            auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          auStack_10398._0_8_ = dVar1 * RVar4;
          if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                       (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
          }
          else {
            *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
            auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
          }
          auStack_10398._0_8_ = (vector<double,_std::allocator<double>_> *)0x0;
          auStack_10398._8_8_ = (pointer)0x0;
          auStack_10398._16_8_ = (double *)0x0;
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          sStack_10370._M_dataplus._M_p = (pointer)(dVar1 * RVar4);
          if (auStack_10398._8_8_ == auStack_10398._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_10398,
                       (iterator)auStack_10398._8_8_,(double *)&sStack_10370);
          }
          else {
            *(pointer *)auStack_10398._8_8_ = sStack_10370._M_dataplus._M_p;
            auStack_10398._8_8_ = auStack_10398._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          sStack_10370._M_dataplus._M_p = (pointer)(dVar1 * RVar4);
          if (auStack_10398._8_8_ == auStack_10398._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_10398,
                       (iterator)auStack_10398._8_8_,(double *)&sStack_10370);
          }
          else {
            *(pointer *)auStack_10398._8_8_ = sStack_10370._M_dataplus._M_p;
            auStack_10398._8_8_ = auStack_10398._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          sStack_10370._M_dataplus._M_p = (pointer)(dVar1 * RVar4);
          if (auStack_10398._8_8_ == auStack_10398._16_8_) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)auStack_10398,
                       (iterator)auStack_10398._8_8_,(double *)&sStack_10370);
          }
          else {
            *(pointer *)auStack_10398._8_8_ = sStack_10370._M_dataplus._M_p;
            auStack_10398._8_8_ = auStack_10398._8_8_ + 8;
          }
          dVar1 = this->eus_;
          RStack_10238 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10220 = this->eus_;
          RStack_10228 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10230 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_101d0 = this->eus_;
          RStack_101d8 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          sStack_100d0._M_dataplus._M_p = (pointer)&sStack_100d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&sStack_100d0,auStack_10038._0_8_,
                     (pointer)(auStack_10038._8_8_ + auStack_10038._0_8_));
          std::vector<double,_std::allocator<double>_>::vector
                    (&vStack_10168,(vector<double,_std::allocator<double>_> *)auStack_102a8);
          std::vector<double,_std::allocator<double>_>::vector
                    (&vStack_10180,(vector<double,_std::allocator<double>_> *)auStack_10398);
          EAMAdapter::makeZhou2005
                    (&EStack_10240,&sStack_100d0,RStack_10308 * RVar5,RStack_10310,RStack_10318,
                     RStack_10320,RStack_10328,RStack_10330,RStack_10338 * RStack_10340,
                     RStack_10348 * RStack_10350,RStack_10250,RStack_10248,&vStack_10168,
                     &vStack_10180,dVar1 * RStack_10238,RStack_10220 * RStack_10228,RStack_10230,
                     RStack_101d0 * RStack_101d8);
          if (vStack_10180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(vStack_10180.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start,
                            (long)vStack_10180.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)vStack_10180.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (vStack_10168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(vStack_10168.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start,
                            (long)vStack_10168.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)vStack_10168.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          sStack_10090.field_2._M_allocated_capacity = sStack_100d0.field_2._M_allocated_capacity;
          _Var14._M_p = sStack_100d0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_100d0._M_dataplus._M_p != &sStack_100d0.field_2) goto LAB_001917d9;
          goto LAB_001917e1;
        }
        goto LAB_00190ff5;
      }
      iVar8 = std::__cxx11::string::compare((char *)&sStack_10218);
      if (iVar8 == 0) {
        if (iVar7 < 0x26) goto LAB_00190ff5;
        dVar1 = this->dus_;
        RStack_10308 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10310 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10318 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10320 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10328 = this->eus_;
        RStack_10330 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10338 = this->eus_;
        RStack_10340 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10348 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10350 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10250 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10248 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        auStack_10038._0_8_ = (vector<double,_std::allocator<double>_> *)0x0;
        auStack_10038._8_8_ = (double *)0x0;
        auStack_10038._16_8_ = (double *)0x0;
        auStack_102a8._0_8_ = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        if (auStack_10038._8_8_ == auStack_10038._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_10038,
                     (iterator)auStack_10038._8_8_,(double *)auStack_102a8);
        }
        else {
          *(undefined8 *)auStack_10038._8_8_ = auStack_102a8._0_8_;
          auStack_10038._8_8_ = auStack_10038._8_8_ + 8;
        }
        auStack_102a8._0_8_ = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        if (auStack_10038._8_8_ == auStack_10038._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_10038,
                     (iterator)auStack_10038._8_8_,(double *)auStack_102a8);
        }
        else {
          *(undefined8 *)auStack_10038._8_8_ = auStack_102a8._0_8_;
          auStack_10038._8_8_ = auStack_10038._8_8_ + 8;
        }
        auStack_102a8._0_8_ = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        if (auStack_10038._8_8_ == auStack_10038._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_10038,
                     (iterator)auStack_10038._8_8_,(double *)auStack_102a8);
        }
        else {
          *(undefined8 *)auStack_10038._8_8_ = auStack_102a8._0_8_;
          auStack_10038._8_8_ = auStack_10038._8_8_ + 8;
        }
        auStack_102a8._0_8_ = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        if (auStack_10038._8_8_ == auStack_10038._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_10038,
                     (iterator)auStack_10038._8_8_,(double *)auStack_102a8);
        }
        else {
          *(undefined8 *)auStack_10038._8_8_ = auStack_102a8._0_8_;
          auStack_10038._8_8_ = auStack_10038._8_8_ + 8;
        }
        auStack_102a8._0_8_ = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        if (auStack_10038._8_8_ == auStack_10038._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_10038,
                     (iterator)auStack_10038._8_8_,(double *)auStack_102a8);
        }
        else {
          *(undefined8 *)auStack_10038._8_8_ = auStack_102a8._0_8_;
          auStack_10038._8_8_ = auStack_10038._8_8_ + 8;
        }
        auStack_102a8._0_8_ = (pointer)0x0;
        auStack_102a8._8_8_ = (double *)0x0;
        auStack_102a8._16_8_ = (double *)0x0;
        auStack_10398._0_8_ = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                     (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
        }
        else {
          *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
          auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
        }
        auStack_10398._0_8_ = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                     (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
        }
        else {
          *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
          auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
        }
        auStack_10398._0_8_ = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                     (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
        }
        else {
          *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
          auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
        }
        auStack_10398._0_8_ = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                     (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
        }
        else {
          *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
          auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
        }
        auStack_10398._0_8_ = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        if (auStack_102a8._8_8_ == auStack_102a8._16_8_) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)auStack_102a8,
                     (iterator)auStack_102a8._8_8_,(double *)auStack_10398);
        }
        else {
          *(undefined8 *)auStack_102a8._8_8_ = auStack_10398._0_8_;
          auStack_102a8._8_8_ = auStack_102a8._8_8_ + 8;
        }
        auStack_10398._0_8_ = (vector<double,_std::allocator<double>_> *)0x0;
        auStack_10398._8_8_ = (pointer)0x0;
        auStack_10398._16_8_ = (double *)0x0;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)auStack_10398,5);
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 8);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x10)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)uVar6,iVar3,(double *)&sStack_10370)
          ;
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 8) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 8);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x10)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)uVar6,iVar3,(double *)&sStack_10370)
          ;
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 8) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 8);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x10)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)uVar6,iVar3,(double *)&sStack_10370)
          ;
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 8) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 8);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x10)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)uVar6,iVar3,(double *)&sStack_10370)
          ;
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 8) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x20);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x28)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x18),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x20) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x20);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x28)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x18),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x20) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x20);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x28)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x18),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x20) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x38);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x40)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x30),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x38) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x38);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x40)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x30),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x38) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x38);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x40)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x30),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x38) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x50);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x58)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x48),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x50) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x50);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x58)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x48),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x50) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x50);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x58)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x48),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x50) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x68);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x70)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x60),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x68) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x68);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x70)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x60),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x68) = iVar3._M_current + 1;
        }
        uVar6 = auStack_10398._0_8_;
        dVar2 = this->eus_;
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        sStack_10370._M_dataplus._M_p = (pointer)(dVar2 * RVar5);
        iVar3._M_current = *(pointer *)(uVar6 + 0x68);
        if (iVar3._M_current == *(pointer *)(uVar6 + 0x70)) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)(uVar6 + 0x60),iVar3,
                     (double *)&sStack_10370);
        }
        else {
          *iVar3._M_current = (double)sStack_10370._M_dataplus._M_p;
          *(double **)(uVar6 + 0x68) = iVar3._M_current + 1;
        }
        std::vector<double,_std::allocator<double>_>::vector
                  (&vStack_10198,(vector<double,_std::allocator<double>_> *)auStack_10038);
        std::vector<double,_std::allocator<double>_>::vector
                  (&vStack_101b0,(vector<double,_std::allocator<double>_> *)auStack_102a8);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&vStack_10050,
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)auStack_10398);
        EAMAdapter::makeZhou2005Oxygen
                  (&EStack_10240,dVar1 * RStack_10308,RStack_10310,RStack_10318,RStack_10320,
                   RStack_10328 * RStack_10330,RStack_10338 * RStack_10340,RStack_10348,RStack_10350
                   ,RStack_10250,RStack_10248,&vStack_10198,&vStack_101b0,&vStack_10050);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&vStack_10050);
        if (vStack_101b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_101b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vStack_101b0.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_101b0.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (vStack_10198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_10198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vStack_10198.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_10198.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)auStack_10398);
        if ((pointer)auStack_102a8._0_8_ != (pointer)0x0) {
          operator_delete((void *)auStack_102a8._0_8_,auStack_102a8._16_8_ - auStack_102a8._0_8_);
        }
        if ((vector<double,_std::allocator<double>_> *)auStack_10038._0_8_ !=
            (vector<double,_std::allocator<double>_> *)0x0) {
          uVar12 = auStack_10038._16_8_ - auStack_10038._0_8_;
          pvVar15 = (vector<double,_std::allocator<double>_> *)auStack_10038._0_8_;
          goto LAB_0019182d;
        }
        goto LAB_00191832;
      }
      iVar8 = std::__cxx11::string::compare((char *)&sStack_10218);
      if (iVar8 == 0) {
        if (0xb < iVar7) {
          dVar1 = this->dus_;
          RStack_10308 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10310 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10318 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10320 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10328 = this->eus_;
          RStack_10330 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10338 = this->eus_;
          RStack_10340 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10348 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10350 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          RStack_10250 = this->eus_;
          RVar4 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
          EAMAdapter::makeZhouRose
                    (&EStack_10240,dVar1 * RStack_10308,RVar5,RStack_10310,RStack_10318,RStack_10320
                     ,RStack_10328 * RStack_10330,RStack_10338 * RStack_10340,RStack_10348,
                     RStack_10350,RStack_10250 * RVar4);
          goto LAB_00191832;
        }
        goto LAB_00190ff5;
      }
      iVar8 = std::__cxx11::string::compare((char *)&sStack_10218);
      if (iVar8 == 0) {
        if (iVar7 < 0xb) goto LAB_00190ff5;
        StringTokenizer::nextToken_abi_cxx11_((string *)auStack_10398,&SStack_10300);
        dVar1 = this->dus_;
        RStack_10308 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RVar5 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10310 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10318 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10320 = this->eus_;
        RStack_10328 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10330 = this->eus_;
        RStack_10338 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10340 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        RStack_10348 = StringTokenizer::nextTokenAsDouble(&SStack_10300);
        input = ForceField::openForceFieldFile(ff,(string *)auStack_10398);
        std::istream::getline((char *)input,(long)auStack_10038);
        vStack_101f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (double *)0x0;
        vStack_101f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (double *)0x0;
        vStack_101f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_01 = input;
        plVar9 = (long *)std::istream::getline((char *)input,(long)auStack_10038);
        if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) == 0) {
          sStack_10370._M_dataplus._M_p = (pointer)&sStack_10370.field_2;
          sVar10 = strlen(auStack_10038);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&sStack_10370,auStack_10038,auStack_10038 + sVar10);
          sStack_100f0._M_dataplus._M_p = (pointer)&sStack_100f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_100f0," ;\t\n\r","");
          StringTokenizer::StringTokenizer
                    ((StringTokenizer *)auStack_102a8,&sStack_10370,&sStack_100f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_100f0._M_dataplus._M_p != &sStack_100f0.field_2) {
            operator_delete(sStack_100f0._M_dataplus._M_p,
                            sStack_100f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_10370._M_dataplus._M_p != &sStack_10370.field_2) {
            operator_delete(sStack_10370._M_dataplus._M_p,
                            sStack_10370.field_2._M_allocated_capacity + 1);
          }
          iVar7 = StringTokenizer::countTokens((StringTokenizer *)auStack_102a8);
          if (iVar7 == 2) {
            iVar7 = StringTokenizer::nextTokenAsInt((StringTokenizer *)auStack_102a8);
            RStack_10350 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)auStack_102a8);
          }
          else {
            builtin_strncpy(painCave.errMsg,"EAMAtomTypesSectionParser Error: Not enough tokens\n",
                            0x34);
            painCave.isFatal = 1;
            simError();
            iVar7 = 0;
            RStack_10350 = 0.0;
          }
          this_01 = (ifstrstream *)auStack_102a8;
          StringTokenizer::~StringTokenizer((StringTokenizer *)this_01);
        }
        else {
          iVar7 = 0;
          RStack_10350 = 0.0;
        }
        parseEAMArray((EAMAtomTypesSectionParser *)this_01,
                      &input->super_basic_istream<char,_std::char_traits<char>_>,&vStack_101f8,iVar7
                     );
        (*(input->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[1])(input)
        ;
        if (vStack_101f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start !=
            vStack_101f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          dVar2 = this->eus_;
          pdVar11 = vStack_101f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            *pdVar11 = *pdVar11 * dVar2;
            pdVar11 = pdVar11 + 1;
          } while (pdVar11 !=
                   vStack_101f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        std::vector<double,_std::allocator<double>_>::vector(&vStack_101c8,&vStack_101f8);
        EAMAdapter::makeOxygenFuncfl
                  (&EStack_10240,dVar1 * RStack_10308,RVar5,RStack_10310,RStack_10318,
                   RStack_10320 * RStack_10328,RStack_10330 * RStack_10338,RStack_10340,RStack_10348
                   ,RStack_10350,(double)iVar7,&vStack_101c8);
        if (vStack_101c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_101c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vStack_101c8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_101c8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (vStack_101f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(vStack_101f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vStack_101f8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_101f8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pdVar13 = (double *)auStack_10398._16_8_;
        pvVar15 = (vector<double,_std::allocator<double>_> *)auStack_10398._0_8_;
        if ((vector<double,_std::allocator<double>_> *)auStack_10398._0_8_ ==
            (vector<double,_std::allocator<double>_> *)(auStack_10398 + 0x10)) goto LAB_00191832;
        goto LAB_0019182a;
      }
      snprintf(painCave.errMsg,2000,
               "EAMAtomTypesSectionParser Error: %s is not a recognized EAM type\n",
               sStack_10218._M_dataplus._M_p);
    }
    painCave.isFatal = 1;
    simError();
  }
LAB_00191832:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10218._M_dataplus._M_p != &sStack_10218.field_2) {
    operator_delete(sStack_10218._M_dataplus._M_p,sStack_10218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10070._M_dataplus._M_p != &sStack_10070.field_2) {
    operator_delete(sStack_10070._M_dataplus._M_p,sStack_10070.field_2._M_allocated_capacity + 1);
  }
LAB_00191874:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SStack_10300.delim_._M_dataplus._M_p != &SStack_10300.delim_.field_2) {
    operator_delete(SStack_10300.delim_._M_dataplus._M_p,
                    SStack_10300.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SStack_10300.tokenString_._M_dataplus._M_p != &SStack_10300.tokenString_.field_2) {
    operator_delete(SStack_10300.tokenString_._M_dataplus._M_p,
                    SStack_10300.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void EAMAtomTypesSectionParser::parseLine(ForceField& ff, const string& line,
                                            int lineNo) {
    eus_ = options_.getMetallicEnergyUnitScaling();
    dus_ = options_.getDistanceUnitScaling();

    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (tokenizer.countTokens() >= 2) {
      std::string atomTypeName     = tokenizer.nextToken();
      std::string eamParameterType = tokenizer.nextToken();
      nTokens -= 2;
      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        EAMAdapter ea = EAMAdapter(atomType);
        toUpper(eamParameterType);

        if (eamParameterType == "FUNCFL") {
          std::string funcflFile = tokenizer.nextToken();
          parseFuncflFile(ff, ea, funcflFile, atomType->getIdent());
        } else if (eamParameterType == "ZHOU" ||
                   eamParameterType == "ZHOU2001") {
          if (nTokens < 20) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string lattice = tokenizer.nextToken();
            toUpper(lattice);
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            std::vector<RealType> Fn;
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            std::vector<RealType> F;
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            RealType eta = tokenizer.nextTokenAsDouble();
            RealType Fe  = eus_ * tokenizer.nextTokenAsDouble();

            ea.makeZhou2001(lattice, re, fe, rhoe, alpha, beta, A, B, kappa,
                            lambda, Fn, F, eta, Fe);
          }
        } else if (eamParameterType == "ZHOU2004") {
          if (nTokens < 23) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string lattice = tokenizer.nextToken();
            toUpper(lattice);
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType rhos   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            std::vector<RealType> Fn;
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            std::vector<RealType> F;
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            RealType eta  = tokenizer.nextTokenAsDouble();
            RealType Fe   = eus_ * tokenizer.nextTokenAsDouble();
            RealType rhol = tokenizer.nextTokenAsDouble();
            RealType rhoh = tokenizer.nextTokenAsDouble();

            ea.makeZhou2004(lattice, re, fe, rhoe, rhos, alpha, beta, A, B,
                            kappa, lambda, Fn, F, eta, Fe, rhol, rhoh);
          }

        } else if (eamParameterType == "ZHOU2005") {
          if (nTokens < 22) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string lattice = tokenizer.nextToken();
            toUpper(lattice);
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType rhos   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            std::vector<RealType> Fn;
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            Fn.push_back(eus_ * tokenizer.nextTokenAsDouble());
            std::vector<RealType> F;
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            F.push_back(eus_ * tokenizer.nextTokenAsDouble());
            RealType F3minus = eus_ * tokenizer.nextTokenAsDouble();
            RealType F3plus  = eus_ * tokenizer.nextTokenAsDouble();
            RealType eta     = tokenizer.nextTokenAsDouble();
            RealType Fe      = eus_ * tokenizer.nextTokenAsDouble();

            ea.makeZhou2005(lattice, re, fe, rhoe, rhos, alpha, beta, A, B,
                            kappa, lambda, Fn, F, F3minus, F3plus, eta, Fe);
          }
        } else if (eamParameterType == "ZHOU2005OXYGEN") {
          if (nTokens < 36) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            RealType gamma  = tokenizer.nextTokenAsDouble();
            RealType nu     = tokenizer.nextTokenAsDouble();

            std::vector<RealType> OrhoLimits;
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());
            OrhoLimits.push_back(tokenizer.nextTokenAsDouble());

            std::vector<RealType> OrhoE;
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());
            OrhoE.push_back(tokenizer.nextTokenAsDouble());

            std::vector<std::vector<RealType>> OF;
            OF.resize(5);
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[0].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[1].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[1].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[1].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[2].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[2].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[2].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[3].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[3].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[3].push_back(eus_ * tokenizer.nextTokenAsDouble());

            OF[4].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[4].push_back(eus_ * tokenizer.nextTokenAsDouble());
            OF[4].push_back(eus_ * tokenizer.nextTokenAsDouble());

            ea.makeZhou2005Oxygen(re, fe, alpha, beta, A, B, kappa, lambda,
                                  gamma, nu, OrhoLimits, OrhoE, OF);
          }
        } else if (eamParameterType == "ZHOUROSE") {
          if (nTokens < 10) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType rhoe   = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();
            RealType F0     = eus_ * tokenizer.nextTokenAsDouble();

            ea.makeZhouRose(re, fe, rhoe, alpha, beta, A, B, kappa, lambda, F0);
          }
        } else if (eamParameterType == "OXYFUNCFL") {
          if (nTokens < 9) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "EAMAtomTypesSectionParser Error: "
                     "Not enough tokens at line %d\n",
                     lineNo);
            painCave.isFatal = 1;
            simError();
          } else {
            std::string funcflFile = tokenizer.nextToken();

            RealType re     = dus_ * tokenizer.nextTokenAsDouble();
            RealType fe     = tokenizer.nextTokenAsDouble();
            RealType alpha  = tokenizer.nextTokenAsDouble();
            RealType beta   = tokenizer.nextTokenAsDouble();
            RealType A      = eus_ * tokenizer.nextTokenAsDouble();
            RealType B      = eus_ * tokenizer.nextTokenAsDouble();
            RealType kappa  = tokenizer.nextTokenAsDouble();
            RealType lambda = tokenizer.nextTokenAsDouble();

            ifstrstream* ppfStream = ff.openForceFieldFile(funcflFile);
            const int bufferSize   = 65535;
            char buffer[bufferSize];

            // skip first line
            ppfStream->getline(buffer, bufferSize);

            std::vector<RealType> F;

            int nrho      = 0;
            RealType drho = 0.0;
            if (ppfStream->getline(buffer, bufferSize)) {
              StringTokenizer tokenizer1(buffer);

              if (tokenizer1.countTokens() == 2) {
                nrho = tokenizer1.nextTokenAsInt();
                drho = tokenizer1.nextTokenAsDouble();
              } else {
                snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                         "EAMAtomTypesSectionParser Error: "
                         "Not enough tokens\n");
                painCave.isFatal = 1;
                simError();
              }
            }

            parseEAMArray(*ppfStream, F, nrho);
            delete ppfStream;

            // Convert to eV using energy unit scaling in force field:
            std::transform(F.begin(), F.end(), F.begin(),
                           std::bind(std::multiplies<RealType>(), eus_,
                                     std::placeholders::_1));

            ea.makeOxygenFuncfl(re, fe, alpha, beta, A, B, kappa, lambda, drho,
                                nrho, F);
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAMAtomTypesSectionParser Error: %s "
                   "is not a recognized EAM type\n",
                   eamParameterType.c_str());
          painCave.isFatal = 1;
          simError();
        }

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Can not find AtomType [%s]\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }
  }